

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_0::AsyncStreamFd::whenWriteDisconnected(AsyncStreamFd *this)

{
  ForkedPromise<void> *other;
  Promise<void> *pPVar1;
  long in_RSI;
  Promise<void> result;
  SourceLocation local_58;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  ForkedPromise<void> fork;
  ForkedPromise<void> *p;
  ForkedPromise<void> *_p477;
  AsyncStreamFd *this_local;
  
  fork.hub.ptr = (ForkHub<kj::_::Void> *)
                 kj::_::readMaybe<kj::ForkedPromise<void>>
                           ((Maybe<kj::ForkedPromise<void>_> *)(in_RSI + 0x78));
  if (fork.hub.ptr == (ForkHub<kj::_::Void> *)0x0) {
    UnixEventPort::FdObserver::whenWriteDisconnected((FdObserver *)local_40);
    SourceLocation::SourceLocation
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,"whenWriteDisconnected",0x1e0,0x13);
    Promise<void>::fork((Promise<void> *)local_38);
    Promise<void>::~Promise((Promise<void> *)local_40);
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&stack0xffffffffffffff88);
    other = mv<kj::ForkedPromise<void>>((ForkedPromise<void> *)local_38);
    Maybe<kj::ForkedPromise<void>_>::operator=
              ((Maybe<kj::ForkedPromise<void>_> *)(in_RSI + 0x78),other);
    pPVar1 = mv<kj::Promise<void>>((Promise<void> *)&stack0xffffffffffffff88);
    Promise<void>::Promise((Promise<void> *)this,pPVar1);
    Promise<void>::~Promise((Promise<void> *)&stack0xffffffffffffff88);
    ForkedPromise<void>::~ForkedPromise((ForkedPromise<void> *)local_38);
  }
  else {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)this);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    KJ_IF_SOME(p, writeDisconnectedPromise) {
      return p.addBranch();
    } else {
      auto fork = observer.whenWriteDisconnected().fork();
      auto result = fork.addBranch();
      writeDisconnectedPromise = kj::mv(fork);
      return kj::mv(result);
    }